

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

SampledSpectrum *
phyr::SampledSpectrum::getFromRGB
          (SampledSpectrum *__return_storage_ptr__,double *rgb,SpectrumType type)

{
  double v;
  CoefficientSpectrum<60> *pCVar1;
  double dVar2;
  SampledSpectrum r;
  CoefficientSpectrum<60> CStack_3e8;
  CoefficientSpectrum<60> local_208;
  
  CoefficientSpectrum<60>::CoefficientSpectrum(&local_208,0.0);
  dVar2 = *rgb;
  v = rgb[1];
  if (type == Reflectance) {
    if ((v < dVar2) || (rgb[2] < dVar2)) {
      if ((dVar2 < v) || (rgb[2] < v)) {
        CoefficientSpectrum<60>::operator*
                  (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectWhite,rgb[2]);
        CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
        if (*rgb <= rgb[1]) {
          CoefficientSpectrum<60>::operator*
                    (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectYellow,*rgb - rgb[2]);
          CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
          dVar2 = rgb[1] - *rgb;
          goto LAB_0010573b;
        }
        CoefficientSpectrum<60>::operator*
                  (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectYellow,rgb[1] - rgb[2]);
        CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
        dVar2 = *rgb - rgb[1];
      }
      else {
        CoefficientSpectrum<60>::operator*
                  (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectWhite,v);
        CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
        if (*rgb <= rgb[2]) {
          CoefficientSpectrum<60>::operator*
                    (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectMagenta,*rgb - rgb[1]);
          CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
          dVar2 = rgb[2] - *rgb;
          goto LAB_001057b2;
        }
        CoefficientSpectrum<60>::operator*
                  (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectMagenta,rgb[2] - rgb[1]);
        CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
        dVar2 = *rgb - rgb[2];
      }
      pCVar1 = (CoefficientSpectrum<60> *)&rgbRefl2SpectRed;
    }
    else {
      CoefficientSpectrum<60>::operator*
                (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectWhite,dVar2);
      CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
      if (rgb[1] <= rgb[2]) {
        CoefficientSpectrum<60>::operator*
                  (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectCyan,rgb[1] - *rgb);
        CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
        dVar2 = rgb[2] - rgb[1];
LAB_001057b2:
        pCVar1 = (CoefficientSpectrum<60> *)&rgbRefl2SpectBlue;
      }
      else {
        CoefficientSpectrum<60>::operator*
                  (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbRefl2SpectCyan,rgb[2] - *rgb);
        CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
        dVar2 = rgb[1] - rgb[2];
LAB_0010573b:
        pCVar1 = (CoefficientSpectrum<60> *)&rgbRefl2SpectGreen;
      }
    }
    CoefficientSpectrum<60>::operator*(&CStack_3e8,pCVar1,dVar2);
    CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
    dVar2 = 0.94;
    goto LAB_001057d7;
  }
  if ((v < dVar2) || (rgb[2] < dVar2)) {
    if ((dVar2 < v) || (rgb[2] < v)) {
      CoefficientSpectrum<60>::operator*
                (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectWhite,rgb[2]);
      CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
      if (*rgb <= rgb[1]) {
        CoefficientSpectrum<60>::operator*
                  (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectYellow,*rgb - rgb[2]);
        CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
        dVar2 = rgb[1] - *rgb;
        goto LAB_001055e3;
      }
      CoefficientSpectrum<60>::operator*
                (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectYellow,rgb[1] - rgb[2]);
      CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
      dVar2 = *rgb - rgb[1];
    }
    else {
      CoefficientSpectrum<60>::operator*
                (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectWhite,v);
      CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
      if (*rgb <= rgb[2]) {
        CoefficientSpectrum<60>::operator*
                  (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectMagenta,*rgb - rgb[1]);
        CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
        dVar2 = rgb[2] - *rgb;
        goto LAB_001056db;
      }
      CoefficientSpectrum<60>::operator*
                (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectMagenta,rgb[2] - rgb[1]);
      CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
      dVar2 = *rgb - rgb[2];
    }
    pCVar1 = (CoefficientSpectrum<60> *)&rgbIllum2SpectRed;
  }
  else {
    CoefficientSpectrum<60>::operator*
              (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectWhite,dVar2);
    CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
    if (rgb[1] <= rgb[2]) {
      CoefficientSpectrum<60>::operator*
                (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectCyan,rgb[1] - *rgb);
      CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
      dVar2 = rgb[2] - rgb[1];
LAB_001056db:
      pCVar1 = (CoefficientSpectrum<60> *)&rgbIllum2SpectBlue;
    }
    else {
      CoefficientSpectrum<60>::operator*
                (&CStack_3e8,(CoefficientSpectrum<60> *)&rgbIllum2SpectCyan,rgb[2] - *rgb);
      CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
      dVar2 = rgb[1] - rgb[2];
LAB_001055e3:
      pCVar1 = (CoefficientSpectrum<60> *)&rgbIllum2SpectGreen;
    }
  }
  CoefficientSpectrum<60>::operator*(&CStack_3e8,pCVar1,dVar2);
  CoefficientSpectrum<60>::operator+=(&local_208,&CStack_3e8);
  dVar2 = 0.8644499778747559;
LAB_001057d7:
  CoefficientSpectrum<60>::operator*=(&local_208,dVar2);
  CoefficientSpectrum<60>::clamp
            (&__return_storage_ptr__->super_CoefficientSpectrum<60>,&local_208,0.0,INFINITY);
  return __return_storage_ptr__;
}

Assistant:

SampledSpectrum SampledSpectrum::getFromRGB(const Real rgb[3], SpectrumType type) {
    SampledSpectrum r;
    if (type == SpectrumType::Reflectance) {
        // Convert reflectance spectrum to RGB
        if (rgb[0] <= rgb[1] && rgb[0] <= rgb[2]) {
            // Compute reflectance _SampledSpectrum_ with _rgb[0]_ as minimum
            r += rgb[0] * rgbRefl2SpectWhite;
            if (rgb[1] <= rgb[2]) {
                r += (rgb[1] - rgb[0]) * rgbRefl2SpectCyan;
                r += (rgb[2] - rgb[1]) * rgbRefl2SpectBlue;
            } else {
                r += (rgb[2] - rgb[0]) * rgbRefl2SpectCyan;
                r += (rgb[1] - rgb[2]) * rgbRefl2SpectGreen;
            }
        } else if (rgb[1] <= rgb[0] && rgb[1] <= rgb[2]) {
            // Compute reflectance _SampledSpectrum_ with _rgb[1]_ as minimum
            r += rgb[1] * rgbRefl2SpectWhite;
            if (rgb[0] <= rgb[2]) {
                r += (rgb[0] - rgb[1]) * rgbRefl2SpectMagenta;
                r += (rgb[2] - rgb[0]) * rgbRefl2SpectBlue;
            } else {
                r += (rgb[2] - rgb[1]) * rgbRefl2SpectMagenta;
                r += (rgb[0] - rgb[2]) * rgbRefl2SpectRed;
            }
        } else {
            // Compute reflectance _SampledSpectrum_ with _rgb[2]_ as minimum
            r += rgb[2] * rgbRefl2SpectWhite;
            if (rgb[0] <= rgb[1]) {
                r += (rgb[0] - rgb[2]) * rgbRefl2SpectYellow;
                r += (rgb[1] - rgb[0]) * rgbRefl2SpectGreen;
            } else {
                r += (rgb[1] - rgb[2]) * rgbRefl2SpectYellow;
                r += (rgb[0] - rgb[1]) * rgbRefl2SpectRed;
            }
        }
        r *= .94;
    } else {
        // Convert illuminant spectrum to RGB
        if (rgb[0] <= rgb[1] && rgb[0] <= rgb[2]) {
            // Compute illuminant _SampledSpectrum_ with _rgb[0]_ as minimum
            r += rgb[0] * rgbIllum2SpectWhite;
            if (rgb[1] <= rgb[2]) {
                r += (rgb[1] - rgb[0]) * rgbIllum2SpectCyan;
                r += (rgb[2] - rgb[1]) * rgbIllum2SpectBlue;
            } else {
                r += (rgb[2] - rgb[0]) * rgbIllum2SpectCyan;
                r += (rgb[1] - rgb[2]) * rgbIllum2SpectGreen;
            }
        } else if (rgb[1] <= rgb[0] && rgb[1] <= rgb[2]) {
            // Compute illuminant _SampledSpectrum_ with _rgb[1]_ as minimum
            r += rgb[1] * rgbIllum2SpectWhite;
            if (rgb[0] <= rgb[2]) {
                r += (rgb[0] - rgb[1]) * rgbIllum2SpectMagenta;
                r += (rgb[2] - rgb[0]) * rgbIllum2SpectBlue;
            } else {
                r += (rgb[2] - rgb[1]) * rgbIllum2SpectMagenta;
                r += (rgb[0] - rgb[2]) * rgbIllum2SpectRed;
            }
        } else {
            // Compute illuminant _SampledSpectrum_ with _rgb[2]_ as minimum
            r += rgb[2] * rgbIllum2SpectWhite;
            if (rgb[0] <= rgb[1]) {
                r += (rgb[0] - rgb[2]) * rgbIllum2SpectYellow;
                r += (rgb[1] - rgb[0]) * rgbIllum2SpectGreen;
            } else {
                r += (rgb[1] - rgb[2]) * rgbIllum2SpectYellow;
                r += (rgb[0] - rgb[1]) * rgbIllum2SpectRed;
            }
        }
        r *= .86445f;
    }

    return r.clamp();
}